

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenu(char *label,bool enabled)

{
  bool bVar1;
  ImGuiPopupData *pIVar2;
  float *pfVar3;
  byte in_SIL;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  ImRect IVar9;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  ImGuiWindow *child_menu_window;
  bool moving_toward_other_child_menu;
  bool want_close;
  bool want_open;
  bool hovered;
  ImU32 text_col;
  float extra_w;
  float min_w;
  float w;
  ImVec2 pos;
  ImVec2 popup_pos;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  bool pressed;
  ImVec2 label_size;
  ImGuiWindowFlags flags;
  bool menu_is_open;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffe98;
  ImGuiPopupFlags in_stack_fffffffffffffe9c;
  float in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  ImRect *in_stack_fffffffffffffea8;
  ImGuiWindow *pIVar10;
  ImGuiPopupFlags popup_flags;
  float in_stack_fffffffffffffeb0;
  ImGuiID id_00;
  uint in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  ImVec2 *in_stack_fffffffffffffec8;
  ImVec2 *this;
  ImGuiWindowFlags flags_00;
  ImGuiID in_stack_fffffffffffffed0;
  ImGuiStyleVar in_stack_fffffffffffffed4;
  float in_stack_fffffffffffffeec;
  ImGuiDir in_stack_fffffffffffffef0;
  ImU32 in_stack_fffffffffffffef4;
  ImDrawList *in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  bool local_f6;
  bool local_f5;
  ImVec2 local_f4;
  float local_ec;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImRect local_d0;
  ImGuiWindow *local_c0;
  byte local_b4;
  byte local_b3;
  byte local_b2;
  byte local_b1;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImU32 local_a0;
  float in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float fVar11;
  ImGuiSelectableFlags in_stack_ffffffffffffff70;
  float flags_01;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 selected;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float fStack_80;
  ImVec2 local_7c;
  float local_74;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImGuiWindow *local_50;
  bool local_46;
  byte local_45;
  ImVec2 local_44;
  undefined4 local_3c;
  byte local_35;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte local_11;
  bool local_1;
  
  selected = (undefined1)((uint)in_stack_ffffffffffffff74 >> 0x18);
  local_11 = in_SIL & 1;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  in_stack_fffffffffffffeb8,
                                  (char *)CONCAT44(in_stack_fffffffffffffeb4,
                                                   in_stack_fffffffffffffeb0));
    local_35 = IsPopupOpen((ImGuiID)in_stack_fffffffffffffeb0,
                           (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    local_3c = 0x10080145;
    if ((local_20->Flags & 0x14000000U) != 0) {
      local_3c = 0x11080145;
    }
    bVar1 = ImVector<unsigned_int>::contains(&local_28->MenusIdSubmittedThisFrame,&local_34);
    if (bVar1) {
      if ((local_35 & 1) == 0) {
        ImGuiNextWindowData::ClearFlags(&local_28->NextWindowData);
      }
      else {
        local_35 = BeginPopupEx(in_stack_fffffffffffffed0,
                                (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      }
      local_1 = (bool)(local_35 & 1);
    }
    else {
      ImVector<unsigned_int>::push_back
                ((ImVector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (uint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      local_44 = CalcTextSize((char *)in_stack_fffffffffffffec8,
                              (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0),
                              SUB84(in_stack_fffffffffffffeb8,0));
      local_f5 = false;
      if ((local_20->Flags & 0x4000000U) == 0) {
        local_f6 = false;
        if ((local_28->BeginPopupStack).Size < (local_28->OpenPopupStack).Size) {
          pIVar2 = ImVector<ImGuiPopupData>::operator[]
                             (&local_28->OpenPopupStack,(local_28->BeginPopupStack).Size);
          in_stack_ffffffffffffff04 = (float)pIVar2->OpenParentId;
          pfVar3 = (float *)ImVector<unsigned_int>::back(&local_20->IDStack);
          local_f6 = in_stack_ffffffffffffff04 == *pfVar3;
        }
        local_f5 = local_f6;
      }
      local_46 = local_f5;
      local_50 = local_28->NavWindow;
      if (local_f5 != false) {
        local_28->NavWindow = local_20;
      }
      ImVec2::ImVec2(&local_58);
      local_60 = (local_20->DC).CursorPos;
      if ((local_20->DC).LayoutType == 0) {
        fVar5 = (local_60.x - 1.0) - (float)(int)((local_30->ItemSpacing).x * 0.5);
        fVar6 = local_60.y - (local_30->FramePadding).y;
        fVar7 = ImGuiWindow::MenuBarHeight
                          ((ImGuiWindow *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        ImVec2::ImVec2(&local_68,fVar5,fVar6 + fVar7);
        local_58 = local_68;
        (local_20->DC).CursorPos.x =
             (float)(int)((local_30->ItemSpacing).x * 0.5) + (local_20->DC).CursorPos.x;
        ImVec2::ImVec2(&local_70,(local_30->ItemSpacing).x * 2.0,(local_30->ItemSpacing).y);
        PushStyleVar(in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
        flags_00 = (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffec8 >> 0x20);
        local_74 = local_44.x;
        ImVec2::ImVec2(&local_7c,local_44.x,0.0);
        local_45 = Selectable((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              (bool)selected,in_stack_ffffffffffffff70,
                              (ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        PopStyleVar(in_stack_fffffffffffffeb4);
        (local_20->DC).CursorPos.x =
             (float)(int)((local_30->ItemSpacing).x * -0.5) + (local_20->DC).CursorPos.x;
      }
      else {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff7c,local_60.x,
                       local_60.y - (local_30->WindowPadding).y);
        local_58.y = fStack_80;
        local_58.x = in_stack_ffffffffffffff7c;
        fVar7 = 0.0;
        fVar5 = ImGuiMenuColumns::DeclColumns
                          ((ImGuiMenuColumns *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                           SUB84(in_stack_fffffffffffffea8,0),in_stack_fffffffffffffea4);
        IVar8 = GetContentRegionAvail();
        fVar11 = IVar8.x;
        flags_01 = IVar8.y;
        fVar6 = ImMax<float>(fVar7,fVar11 - fVar5);
        in_stack_fffffffffffffeb4 = (uint)local_35;
        this = (ImVec2 *)&stack0xffffffffffffff64;
        ImVec2::ImVec2(this,fVar5,fVar7);
        flags_00 = (ImGuiWindowFlags)((ulong)this >> 0x20);
        local_45 = Selectable((char *)CONCAT44(in_stack_ffffffffffffff7c,fVar5),
                              SUB41((uint)fVar6 >> 0x18,0),(ImGuiSelectableFlags)flags_01,
                              (ImVec2 *)CONCAT44(fVar11,in_stack_ffffffffffffff68));
        local_a0 = GetColorU32(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
        ImVec2::ImVec2(&local_b0,
                       local_28->FontSize * 0.3 + (local_20->DC).MenuColumns.Pos[2] + fVar6,fVar7);
        local_a8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                             ,(ImVec2 *)0x1af1b5);
        IVar8.y = in_stack_ffffffffffffff04;
        IVar8.x = in_stack_ffffffffffffff00;
        RenderArrow(in_stack_fffffffffffffef8,IVar8,in_stack_fffffffffffffef4,
                    in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      }
      id_00 = (uint)in_stack_fffffffffffffeb0 & 0xffffff;
      if ((local_11 & 1) != 0) {
        bVar1 = ItemHoverable(in_stack_fffffffffffffea8,(ImGuiID)in_stack_fffffffffffffea4);
        id_00 = CONCAT13(bVar1,(int3)id_00);
      }
      popup_flags = (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      local_b1 = (byte)(id_00 >> 0x18);
      if ((local_46 & 1U) != 0) {
        local_28->NavWindow = local_50;
      }
      local_b2 = 0;
      local_b3 = 0;
      if ((local_20->DC).LayoutType == 1) {
        local_b4 = 0;
        if (((local_28->BeginPopupStack).Size < (local_28->OpenPopupStack).Size) &&
           (pIVar2 = ImVector<ImGuiPopupData>::operator[]
                               (&local_28->OpenPopupStack,(local_28->BeginPopupStack).Size),
           pIVar2->SourceWindow == local_20)) {
          pIVar2 = ImVector<ImGuiPopupData>::operator[]
                             (&local_28->OpenPopupStack,(local_28->BeginPopupStack).Size);
          pIVar10 = pIVar2->Window;
        }
        else {
          pIVar10 = (ImGuiWindow *)0x0;
        }
        local_c0 = pIVar10;
        if (((local_28->HoveredWindow == local_20) && (pIVar10 != (ImGuiWindow *)0x0)) &&
           ((local_20->Flags & 0x400U) == 0)) {
          IVar9 = ImGuiWindow::Rect((ImGuiWindow *)0x1af356);
          local_d0.Min = IVar9.Min;
          local_d0.Max = IVar9.Max;
          local_d8 = operator-((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                               (ImVec2 *)0x1af386);
          if ((local_c0->Pos).x <= (local_20->Pos).x) {
            local_e0 = ImRect::GetTR((ImRect *)
                                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          }
          else {
            local_e0 = ImRect::GetTL(&local_d0);
          }
          if ((local_c0->Pos).x <= (local_20->Pos).x) {
            local_e8 = ImRect::GetBR(&local_d0);
          }
          else {
            local_e8 = ImRect::GetBL((ImRect *)
                                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          }
          local_ec = ImClamp<float>(ABS(local_d8.x - local_e0.x) * 0.3,5.0,30.0);
          uVar4 = -(uint)((local_20->Pos).x < (local_c0->Pos).x);
          local_d8.x = (float)(~uVar4 & 0x3f000000 | uVar4 & 0xbf000000) + local_d8.x;
          in_stack_fffffffffffffea0 = local_d8.y;
          fVar5 = ImMax<float>((local_e0.y - local_ec) - local_d8.y,-100.0);
          local_e0.y = in_stack_fffffffffffffea0 + fVar5;
          in_stack_fffffffffffffea4 = local_d8.y;
          fVar5 = ImMin<float>((local_e8.y + local_ec) - local_d8.y,100.0);
          local_e8.y = in_stack_fffffffffffffea4 + fVar5;
          local_b4 = ImTriangleContainsPoint(&local_d8,&local_e0,&local_e8,&(local_28->IO).MousePos)
          ;
        }
        popup_flags = (ImGuiPopupFlags)((ulong)pIVar10 >> 0x20);
        if (((((local_35 & 1) != 0) && ((local_b1 & 1) == 0)) &&
            ((local_28->HoveredWindow == local_20 &&
             ((local_28->HoveredIdPreviousFrame != 0 &&
              (local_28->HoveredIdPreviousFrame != local_34)))))) && ((local_b4 & 1) == 0)) {
          local_b3 = 1;
        }
        if ((((local_35 & 1) == 0) && ((local_b1 & 1) != 0)) && ((local_45 & 1) != 0)) {
          local_b2 = 1;
        }
        else if ((((local_35 & 1) == 0) && ((local_b1 & 1) != 0)) && ((local_b4 & 1) == 0)) {
          local_b2 = 1;
        }
        if (local_28->NavActivateId == local_34) {
          local_b3 = local_35 & 1;
          local_b2 = (local_35 ^ 0xff) & 1;
        }
        if (((local_28->NavId == local_34) && ((local_28->NavMoveRequest & 1U) != 0)) &&
           (local_28->NavMoveDir == 1)) {
          local_b2 = 1;
          NavMoveRequestCancel();
        }
      }
      else if ((((local_35 & 1) == 0) || ((local_45 & 1) == 0)) || ((local_46 & 1U) == 0)) {
        if (((local_45 & 1) == 0) &&
           (((local_b1 == 0 || ((local_46 & 1U) == 0)) || ((local_35 & 1) != 0)))) {
          if (((local_28->NavId == local_34) && ((local_28->NavMoveRequest & 1U) != 0)) &&
             (local_28->NavMoveDir == 3)) {
            local_b2 = 1;
            NavMoveRequestCancel();
          }
        }
        else {
          local_b2 = 1;
        }
      }
      else {
        local_b3 = 1;
        local_35 = 0;
        local_b2 = 0;
      }
      if ((local_11 & 1) == 0) {
        local_b3 = 1;
      }
      if (((local_b3 & 1) != 0) && (bVar1 = IsPopupOpen(id_00,popup_flags), bVar1)) {
        ClosePopupToLevel(in_stack_fffffffffffffeb4,SUB41(id_00 >> 0x18,0));
      }
      if ((((local_35 & 1) == 0) && ((local_b2 & 1) != 0)) &&
         ((local_28->BeginPopupStack).Size < (local_28->OpenPopupStack).Size)) {
        OpenPopup((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                  in_stack_fffffffffffffe9c);
        local_1 = false;
      }
      else {
        local_35 = (local_35 & 1) != 0 || (local_b2 & 1) != 0;
        if ((local_b2 & 1) != 0) {
          OpenPopup((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                    in_stack_fffffffffffffe9c);
        }
        if ((local_35 & 1) == 0) {
          ImGuiNextWindowData::ClearFlags(&local_28->NextWindowData);
        }
        else {
          ImVec2::ImVec2(&local_f4,0.0,0.0);
          SetNextWindowPos(&local_58,1,&local_f4);
          local_35 = BeginPopupEx(in_stack_fffffffffffffed0,flags_00);
        }
        local_1 = (bool)(local_35 & 1);
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu))
        flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. ImGuiStorage mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    bool pressed;
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float min_w = window->DC.MenuColumns.DeclColumns(label_size.x, 0.0f, IM_FLOOR(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_SpanAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(min_w, 0.0f));
        ImU32 text_col = GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled);
        RenderArrow(window->DrawList, pos + ImVec2(window->DC.MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), text_col, ImGuiDir_Right);
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_other_child_menu = false;

        ImGuiWindow* child_menu_window = (g.BeginPopupStack.Size < g.OpenPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].SourceWindow == window) ? g.OpenPopupStack[g.BeginPopupStack.Size].Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            // FIXME-DPI: Values should be derived from a master "scale" factor.
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
            ImVec2 tb = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f);    // add a bit of extra slack.
            ta.x += (window->Pos.x < child_menu_window->Pos.x) ? -0.5f : +0.5f; // to avoid numerical issues
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);                // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
            moving_toward_other_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }
        if (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_toward_other_child_menu)
            want_close = true;

        if (!menu_is_open && hovered && pressed) // Click to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_other_child_menu) // Hover to open
            want_open = true;

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id, ImGuiPopupFlags_None))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiCond_Always); // Note: this is super misleading! The value will serve as reference for FindBestWindowPosForPopup(), not actual pos.
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}